

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall GameLoop::~GameLoop(GameLoop *this)

{
  _Vector_base<Player_*,_std::allocator<Player_*>_> *this_00;
  Deck *this_01;
  
  this_00 = &this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>;
  if (this_00 != (_Vector_base<Player_*,_std::allocator<Player_*>_> *)0x0) {
    std::_Vector_base<Player_*,_std::allocator<Player_*>_>::~_Vector_base(this_00);
  }
  operator_delete(this_00,0x18);
  this->gameMap = (Map *)0x0;
  this_01 = this->gameDeck;
  if (this_01 != (Deck *)0x0) {
    Deck::~Deck(this_01);
  }
  operator_delete(this_01,0x18);
  return;
}

Assistant:

GameLoop::~GameLoop() {
    delete allPlayers;
    // In tournament mode, the maps are stored in a vector (heap memory) so we cant delete them if we reuse the map
    this->gameMap = nullptr;
    delete this->gameDeck;
}